

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

bool slang::parsing::checkSubroutineName(NameSyntax *name)

{
  bool bVar1;
  NameSyntax *pNVar2;
  SyntaxNode *in_RDI;
  ScopedNameSyntax *scoped;
  anon_class_1_0_00000001 checkKind;
  bool local_21;
  __0 local_11 [16];
  bool local_1;
  
  local_11[0] = (__0)0x0;
  if (in_RDI->kind == ScopedName) {
    slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(in_RDI);
    pNVar2 = not_null<slang::syntax::NameSyntax_*>::operator*
                       ((not_null<slang::syntax::NameSyntax_*> *)0xa4265d);
    bVar1 = checkSubroutineName(slang::syntax::NameSyntax_const&)::$_0::operator()(local_11,pNVar2);
    local_21 = false;
    if (bVar1) {
      pNVar2 = not_null<slang::syntax::NameSyntax_*>::operator*
                         ((not_null<slang::syntax::NameSyntax_*> *)0xa42687);
      local_21 = checkSubroutineName(slang::syntax::NameSyntax_const&)::$_0::operator()
                           (local_11,pNVar2);
    }
    local_1 = local_21;
  }
  else {
    local_1 = checkSubroutineName(slang::syntax::NameSyntax_const&)::$_0::operator()
                        (local_11,(NameSyntax *)in_RDI);
  }
  return local_1;
}

Assistant:

static bool checkSubroutineName(const NameSyntax& name) {
    auto checkKind = [](auto& node) {
        return node.kind == SyntaxKind::IdentifierName || node.kind == SyntaxKind::ConstructorName;
    };

    if (name.kind == SyntaxKind::ScopedName) {
        auto& scoped = name.as<ScopedNameSyntax>();
        return checkKind(*scoped.left) && checkKind(*scoped.right);
    }

    return checkKind(name);
}